

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmorpher.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1a0014::VmorpherState::deviceUpdate(VmorpherState *this,ALCdevice *param_1)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&this->mChans[0].Formants[0][0].mS1 + lVar2) = 0;
    *(undefined8 *)((long)&this->mChans[0].Formants[0][1].mS1 + lVar2) = 0;
    *(undefined8 *)((long)&this->mChans[0].Formants[0][2].mS1 + lVar2) = 0;
    *(undefined8 *)((long)&this->mChans[0].Formants[0][3].mS1 + lVar2) = 0;
    *(undefined8 *)((long)&this->mChans[0].Formants[1][0].mS1 + lVar2) = 0;
    *(undefined8 *)((long)&this->mChans[0].Formants[1][1].mS1 + lVar2) = 0;
    *(undefined8 *)((long)&this->mChans[0].Formants[1][2].mS1 + lVar2) = 0;
    *(undefined8 *)((long)&this->mChans[0].Formants[1][3].mS1 + lVar2) = 0;
    puVar1 = (undefined8 *)((long)this->mChans[0].CurrentGains + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mChans[0].CurrentGains + lVar2 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mChans[0].CurrentGains + lVar2 + 0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->mChans[0].CurrentGains + lVar2 + 0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x100;
  } while (lVar2 != 0x1000);
  return;
}

Assistant:

void VmorpherState::deviceUpdate(const ALCdevice* /*device*/)
{
    for(auto &e : mChans)
    {
        std::for_each(std::begin(e.Formants[VOWEL_A_INDEX]), std::end(e.Formants[VOWEL_A_INDEX]),
            std::mem_fn(&FormantFilter::clear));
        std::for_each(std::begin(e.Formants[VOWEL_B_INDEX]), std::end(e.Formants[VOWEL_B_INDEX]),
            std::mem_fn(&FormantFilter::clear));
        std::fill(std::begin(e.CurrentGains), std::end(e.CurrentGains), 0.0f);
    }
}